

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.hpp
# Opt level: O0

reference __thiscall
duckdb::
vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>::back
          (vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
           *this)

{
  bool bVar1;
  string *msg;
  reference pvVar2;
  vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
  *in_RDI;
  allocator *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  allocator local_29;
  string local_28 [40];
  
  bVar1 = ::std::
          vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
          ::empty((vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
                   *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if (!bVar1) {
    ::std::
    vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>_>_>
    ::size(in_RDI);
    pvVar2 = get<true>((vector<duckdb::unique_ptr<duckdb::CTENode,_std::default_delete<duckdb::CTENode>,_true>,_true>
                        *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (size_type)in_RDI);
    return pvVar2;
  }
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_29;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_28,"\'back\' called on an empty vector!",this_00);
  InternalException::InternalException((InternalException *)this_00,msg);
  __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

typename original::reference back() { // NOLINT: hiding on purpose
		if (MemorySafety<SAFE>::ENABLED && original::empty()) {
			throw InternalException("'back' called on an empty vector!");
		}
		return get<SAFE>(original::size() - 1);
	}